

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateFastLdElemI(Lowerer *this,Instr **ldElem,bool *instrIsInHelperBlockRef)

{
  Opnd **ppOVar1;
  IRType IVar2;
  ushort uVar3;
  uint uVar4;
  IndirOpnd *indirOpnd;
  Instr *insertBeforeInstr;
  Func *pFVar5;
  code *pcVar6;
  bool bVar7;
  OpndKind OVar8;
  bool bVar9;
  ValueType valueType;
  uint32 uVar10;
  BailOutKind BVar11;
  uint uVar12;
  uint uVar13;
  undefined4 *puVar14;
  LowererMD *pLVar15;
  LabelInstr *target;
  Instr *pIVar16;
  HelperCallOpnd *this_00;
  IndirOpnd *opnd;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar28;
  BailOutInfo *pBVar17;
  IndirOpnd *pIVar18;
  RegOpnd *pRVar19;
  RegOpnd *pRVar20;
  undefined7 extraout_var_01;
  ProfiledInstr *pPVar21;
  IntConstOpnd *pIVar22;
  BranchInstr *instr;
  JITTimeFunctionBody *pJVar23;
  FunctionJITTimeInfo *pFVar24;
  char16 *pcVar25;
  Opnd *pOVar26;
  char16 *pcVar27;
  ushort uVar29;
  LowererMD *pLVar30;
  char cVar31;
  JnHelperMethod fnHelper;
  Lowerer *this_01;
  char16_t *pcVar32;
  byte bVar33;
  FldInfoFlags flags;
  byte bVar34;
  Opnd *pOVar35;
  wchar local_228 [4];
  char16 debugStringBuffer_1 [42];
  undefined1 local_1c8 [8];
  char16 debugStringBuffer [42];
  undefined1 local_c8 [8];
  AutoReuseOpnd autoReuseIndirOpnd;
  AutoReuseOpnd autoReuseReg;
  RegOpnd *local_78;
  Opnd *maskOpnd;
  LowererMD *local_68;
  LowererMD *local_60;
  bool local_54;
  bool local_53;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_52;
  uint local_50;
  bool isTypedArrayElement;
  bool isStringIndex;
  ValueType baseValueType;
  bool indirOpndOverflowed;
  bool local_31 [8];
  bool emitBailout;
  
  if (instrIsInHelperBlockRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x46fa,"(instrIsInHelperBlockRef)","instrIsInHelperBlockRef");
    if (!bVar7) goto LAB_005b7d8b;
    *puVar14 = 0;
  }
  *instrIsInHelperBlockRef = false;
  indirOpnd = (IndirOpnd *)(*ldElem)->m_src1;
  OVar8 = IR::Opnd::GetKind((Opnd *)indirOpnd);
  if (OVar8 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4704,"(src1->IsIndirOpnd())","Expected indirOpnd on LdElementI");
    if (!bVar7) goto LAB_005b7d8b;
    *puVar14 = 0;
  }
  OVar8 = IR::Opnd::GetKind((Opnd *)indirOpnd);
  if (OVar8 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar7) goto LAB_005b7d8b;
    *puVar14 = 0;
  }
  if ((*ldElem)->m_opcode == LdMethodElem) {
    local_1c8._0_2_ = (indirOpnd->m_baseOpnd->super_Opnd).m_valueType.field_0.bits;
    bVar7 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)local_1c8);
    bVar34 = 1;
    if (bVar7) goto LAB_005b6ae5;
  }
  bVar9 = false;
  local_68 = (LowererMD *)IR::Instr::GetOrCreateContinueLabel(*ldElem,false);
  pLVar15 = (LowererMD *)IR::LabelInstr::New(Label,this->m_func,true);
  bVar7 = IR::Instr::DoStackArgsOpt(*ldElem);
  if (!bVar7) {
    local_1c8._0_2_ = (indirOpnd->m_baseOpnd->super_Opnd).m_valueType.field_0.bits;
    bVar9 = ValueType::IsLikelyNativeArray((ValueType *)local_1c8);
  }
  local_31[0] = false;
  bVar7 = IR::Instr::DoStackArgsOpt(*ldElem);
  if (bVar7) {
    GenerateFastArgumentsLdElemI(this,*ldElem,(LabelInstr *)local_68);
    local_31[0] = true;
LAB_005b65dd:
    bVar33 = 1;
    target = (LabelInstr *)0x0;
    pLVar30 = (LowererMD *)0x0;
  }
  else {
    bVar7 = GenerateFastStringLdElem(this,*ldElem,(LabelInstr *)pLVar15,(LabelInstr *)local_68);
    if (bVar7) goto LAB_005b65dd;
    if (bVar9 == false) {
      local_60 = (LowererMD *)0x0;
      pLVar30 = pLVar15;
LAB_005b6b75:
      if ((*ldElem)->m_kind == InstrKindProfiled) {
        flags = *(FldInfoFlags *)((long)(*ldElem)[1]._vptr_Instr + 4);
      }
      else {
        flags = FldInfo_NoInfo;
      }
      baseValueType.field_0.bits._1_1_ = 0;
      local_78 = (RegOpnd *)0x0;
      pIVar16 = *ldElem;
      OVar8 = IR::Opnd::GetKind((Opnd *)indirOpnd);
      if (OVar8 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar7) goto LAB_005b7d8b;
        *puVar14 = 0;
      }
      opnd = GenerateFastElemICommon
                       (this,pIVar16,false,indirOpnd,(LabelInstr *)pLVar15,(LabelInstr *)pLVar30,
                        (LabelInstr *)local_68,&local_54,&local_53,local_31,(Opnd **)&local_78,
                        (LabelInstr **)0x0,true,false,false,(LabelInstr *)0x0,
                        (bool *)((long)&baseValueType.field_0.bits + 1),flags);
      pOVar35 = (*ldElem)->m_dst;
      OVar8 = IR::Opnd::GetKind(pOVar35);
      uVar28 = extraout_var;
      if (OVar8 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar7) goto LAB_005b7d8b;
        *puVar14 = 0;
        uVar28 = extraout_var_00;
      }
      maskOpnd = (Opnd *)CONCAT71(uVar28,opnd != (IndirOpnd *)0x0);
      if (opnd == (IndirOpnd *)0x0) {
        if (((((*ldElem)->field_0x38 & 0x10) != 0) &&
            (BVar11 = IR::Instr::GetBailOutKind(*ldElem), (BVar11 >> 0x11 & 1) != 0)) &&
           (baseValueType.field_0.bits._1_1_ == '\0')) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x4769,
                             "(!(ldElem->HasBailOutInfo() && ldElem->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall) || indirOpndOverflowed)"
                             ,
                             "!(ldElem->HasBailOutInfo() && ldElem->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall) || indirOpndOverflowed"
                            );
          if (!bVar7) goto LAB_005b7d8b;
          *puVar14 = 0;
        }
        if ((baseValueType.field_0.bits._1_1_ == '\x01') && (((*ldElem)->field_0x38 & 0x10) != 0)) {
          BVar11 = IR::Instr::GetBailOutKind(*ldElem);
          cVar31 = (char)maskOpnd;
          if ((BVar11 & ~BailOutKindBits) == BailOutConventionalTypedArrayAccessOnly) {
            bVar34 = 0;
            bVar33 = 0;
            if (pOVar35->m_type == TyVar) {
              pOVar26 = LoadLibraryValueOpnd(this,*ldElem,ValueUndefined);
              InsertMove(pOVar35,pOVar26,*ldElem,true);
              IR::Instr::FreeSrc1(*ldElem);
              IR::Instr::FreeDst(*ldElem);
              IR::Instr::Remove(*ldElem);
              cVar31 = (char)maskOpnd;
              bVar34 = 1;
              bVar33 = 1;
            }
          }
          else {
            bVar34 = 1;
            bVar33 = 0;
          }
          if (!(bool)((BVar11 & (BailOutOnArrayAccessHelperCall|
                                BailOutConventionalNativeArrayAccessOnly)) == BailOutInvalid &
                     bVar34)) {
            if ((byte)(pOVar35->m_type - TyFloat32) < 2) {
              pIVar22 = (IntConstOpnd *)IR::FloatConstOpnd::New(NAN,TyFloat64,this->m_func);
            }
            else {
              pIVar22 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,true);
            }
            InsertMove(pOVar35,&pIVar22->super_Opnd,*ldElem,true);
            IR::Instr::FreeSrc1(*ldElem);
            IR::Instr::FreeDst(*ldElem);
            GenerateBailOut(this,*ldElem,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
            bVar33 = 1;
            cVar31 = (char)maskOpnd;
          }
          bVar34 = bVar33 ^ 1;
          target = (LabelInstr *)0x0;
          pLVar30 = local_60;
          goto LAB_005b7d15;
        }
        if (pOVar35->m_type == TyVar) {
          pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
          uVar12 = JITTimeFunctionBody::GetSourceContextId(pJVar23);
          pFVar24 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
          uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar24);
          bVar7 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_015cd718,TypedArrayTypeSpecPhase,uVar12,uVar13);
          bVar34 = 1;
          if (bVar7) {
            pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
            uVar12 = JITTimeFunctionBody::GetSourceContextId(pJVar23);
            pFVar24 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
            uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar24);
            bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,LowererPhase,uVar12,uVar13);
            if (bVar7) {
              pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
              pcVar25 = JITTimeFunctionBody::GetDisplayName(pJVar23);
              pFVar24 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
              pcVar27 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar24,(wchar (*) [42])local_1c8);
              Js::OpCodeUtil::GetOpCodeName((*ldElem)->m_opcode);
              Output::Print(L"Typed Array Lowering: function: %s (%s): instr %s, not specialized by glob opt due to negative or not likely int index.\n"
                            ,pcVar25,pcVar27);
              Output::Flush();
            }
          }
          bVar33 = 0;
          target = (LabelInstr *)0x0;
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x47af,"(false)",
                             "Global optimizer shouldn\'t have specialized this instruction.");
          if (!bVar7) goto LAB_005b7d8b;
          *puVar14 = 0;
          OVar8 = IR::Opnd::GetKind(pOVar35);
          if (OVar8 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x47b0,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
            if (!bVar7) goto LAB_005b7d8b;
            *puVar14 = 0;
          }
          bVar33 = 0;
          pIVar22 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,true);
          InsertMove(pOVar35,&pIVar22->super_Opnd,*ldElem,true);
          IR::Instr::FreeSrc1(*ldElem);
          IR::Instr::FreeDst(*ldElem);
          GenerateBailOut(this,*ldElem,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
          target = (LabelInstr *)0x0;
          bVar34 = 0;
        }
      }
      else {
        local_50 = (uint)pOVar35->m_type;
        local_c8 = (undefined1  [8])0x0;
        IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_c8,&opnd->super_Opnd,this->m_func,true)
        ;
        OVar8 = IR::Opnd::GetKind((Opnd *)indirOpnd);
        if (OVar8 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (!bVar7) goto LAB_005b7d8b;
          *puVar14 = 0;
        }
        local_52 = (indirOpnd->m_baseOpnd->super_Opnd).m_valueType.field_0;
        if ((((*ldElem)->field_0x38 & 0x10) == 0) ||
           (uVar10 = IR::Instr::GetByteCodeOffset(*ldElem), uVar10 == 0xffffffff)) {
LAB_005b6dbc:
          OVar8 = IR::Opnd::GetKind((Opnd *)indirOpnd);
          if (OVar8 != OpndKindIndir) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar14 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
            if (!bVar7) goto LAB_005b7d8b;
            *puVar14 = 0;
          }
          if (indirOpnd->m_indexOpnd != (RegOpnd *)0x0) {
            OVar8 = IR::Opnd::GetKind((Opnd *)indirOpnd);
            if (OVar8 != OpndKindIndir) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar14 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
              if (!bVar7) goto LAB_005b7d8b;
              *puVar14 = 0;
            }
            bVar7 = IR::Opnd::IsEqual(pOVar35,&indirOpnd->m_indexOpnd->super_Opnd);
            if (bVar7) goto LAB_005b6e99;
          }
        }
        else {
          pBVar17 = IR::Instr::GetBailOutInfo(*ldElem);
          uVar4 = pBVar17->bailOutOffset;
          uVar10 = IR::Instr::GetByteCodeOffset(*ldElem);
          if (uVar10 < uVar4) goto LAB_005b6dbc;
          pIVar18 = IR::Opnd::AsIndirOpnd((Opnd *)indirOpnd);
          bVar7 = IR::Opnd::IsEqual(pOVar35,&pIVar18->m_baseOpnd->super_Opnd);
          if (!bVar7) goto LAB_005b6dbc;
LAB_005b6e99:
          pIVar16 = IR::Instr::SinkDst(*ldElem,Ld_A,RegNOREG,(Instr *)0x0);
          IR::Instr::Unlink(pIVar16);
          IR::Instr::InsertAfter((Instr *)local_68,pIVar16);
          LowererMD::ChangeToAssign(pIVar16);
          pOVar35 = (*ldElem)->m_dst;
        }
        if (local_54 == true) {
          autoReuseIndirOpnd.autoDelete = false;
          autoReuseIndirOpnd.wasInUse = false;
          autoReuseIndirOpnd._18_6_ = 0;
          OVar8 = IR::Opnd::GetKind(pOVar35);
          if (OVar8 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar14 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x47df,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
            if (!bVar7) goto LAB_005b7d8b;
            *puVar14 = 0;
          }
          if ((byte)((opnd->super_Opnd).m_type - TyFloat32) < 2) {
            if ((local_50 != 10) && (local_50 != 0x17)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar14 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x47e3,"((dstType == TyFloat64) || (dstType == TyVar))",
                                 "For Float32Array LdElemI\'s dst should be specialized to TyFloat64 or not at all."
                                );
              if (!bVar7) goto LAB_005b7d8b;
              *puVar14 = 0;
            }
            IVar2 = (opnd->super_Opnd).m_type;
            if (IVar2 == TyFloat64) {
LAB_005b7833:
              if (local_50 == 10) {
                pRVar20 = IR::Opnd::AsRegOpnd(pOVar35);
              }
              else {
                pRVar20 = IR::RegOpnd::New(TyFloat64,this->m_func);
              }
              IR::AutoReuseOpnd::Initialize
                        ((AutoReuseOpnd *)&autoReuseIndirOpnd.autoDelete,&pRVar20->super_Opnd,
                         this->m_func,true);
              InsertMove(&pRVar20->super_Opnd,&opnd->super_Opnd,*ldElem,true);
            }
            else {
              if (IVar2 != TyFloat32) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                *puVar14 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                   ,0x47f3,"(indirOpnd->IsFloat64())","indirOpnd->IsFloat64()");
                if (!bVar7) goto LAB_005b7d8b;
                *puVar14 = 0;
                goto LAB_005b7833;
              }
              pRVar19 = IR::RegOpnd::New(TyFloat32,this->m_func);
              local_1c8 = (undefined1  [8])0x0;
              IR::AutoReuseOpnd::Initialize
                        ((AutoReuseOpnd *)local_1c8,&pRVar19->super_Opnd,this->m_func,true);
              InsertMove(&pRVar19->super_Opnd,&opnd->super_Opnd,*ldElem,true);
              if (local_50 == 10) {
                pRVar20 = IR::Opnd::AsRegOpnd(pOVar35);
              }
              else {
                pRVar20 = IR::RegOpnd::New(TyFloat64,this->m_func);
              }
              IR::AutoReuseOpnd::Initialize
                        ((AutoReuseOpnd *)&autoReuseIndirOpnd.autoDelete,&pRVar20->super_Opnd,
                         this->m_func,true);
              InsertConvertFloat32ToFloat64(&pRVar20->super_Opnd,&pRVar19->super_Opnd,*ldElem);
              IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_1c8);
            }
            if (local_50 != 10) {
              pRVar19 = IR::Opnd::AsRegOpnd(pOVar35);
              LowererMD::SaveDoubleToVar(&this->m_lowererMD,pRVar19,pRVar20,*ldElem,*ldElem,false);
            }
            pIVar16 = IR::Instr::New(UCOMISD,this->m_func);
            if (pIVar16->m_src1 != (Opnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar14 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x16c,"(this->m_src1 == __null)",
                                 "Trying to overwrite existing src.");
              if (!bVar7) goto LAB_005b7d8b;
              *puVar14 = 0;
            }
            pFVar5 = pIVar16->m_func;
            if ((pRVar20->super_Opnd).isDeleted == true) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar14 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x14,"(!isDeleted)","Using deleted operand");
              if (!bVar7) goto LAB_005b7d8b;
              *puVar14 = 0;
            }
            bVar34 = (pRVar20->super_Opnd).field_0xb;
            pRVar19 = pRVar20;
            if ((bVar34 & 2) != 0) {
              pRVar19 = (RegOpnd *)IR::Opnd::Copy(&pRVar20->super_Opnd,pFVar5);
              bVar34 = (pRVar19->super_Opnd).field_0xb;
            }
            (pRVar19->super_Opnd).field_0xb = bVar34 | 2;
            pIVar16->m_src1 = &pRVar19->super_Opnd;
            if (pIVar16->m_src2 != (Opnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar14 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x18b,"(this->m_src2 == __null)",
                                 "Trying to overwrite existing src.");
              if (!bVar7) goto LAB_005b7d8b;
              *puVar14 = 0;
            }
            pFVar5 = pIVar16->m_func;
            if ((pRVar20->super_Opnd).isDeleted == true) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar14 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x14,"(!isDeleted)","Using deleted operand");
              if (!bVar7) goto LAB_005b7d8b;
              *puVar14 = 0;
            }
            bVar34 = (pRVar20->super_Opnd).field_0xb;
            if ((bVar34 & 2) != 0) {
              pRVar20 = (RegOpnd *)IR::Opnd::Copy(&pRVar20->super_Opnd,pFVar5);
              bVar34 = (pRVar20->super_Opnd).field_0xb;
            }
            (pRVar20->super_Opnd).field_0xb = bVar34 | 2;
            pIVar16->m_src2 = &pRVar20->super_Opnd;
            IR::Instr::InsertBefore(*ldElem,pIVar16);
            instr = IR::BranchInstr::New(JP,(LabelInstr *)pLVar15,this->m_func);
            IR::Instr::InsertBefore(*ldElem,&instr->super_Instr);
            if (local_50 == 10) {
              local_31[0] = true;
            }
          }
          else {
            if ((local_50 != 3) && (local_50 != 0x17)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar14 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x482a,"((dstType == TyInt32) || (dstType == TyVar))",
                                 "For Int/UintArray LdElemI\'s dst should be specialized to TyInt32 or not at all."
                                );
              if (!bVar7) goto LAB_005b7d8b;
              *puVar14 = 0;
            }
            if (local_50 == 3) {
              pRVar20 = IR::Opnd::AsRegOpnd(pOVar35);
            }
            else {
              pRVar20 = IR::RegOpnd::New(TyInt32,this->m_func);
            }
            IR::AutoReuseOpnd::Initialize
                      ((AutoReuseOpnd *)&autoReuseIndirOpnd.autoDelete,&pRVar20->super_Opnd,
                       this->m_func,true);
            if ((opnd->super_Opnd).m_type != TyUint32) {
              valueType = ValueType::GetTaggedInt();
              IR::Opnd::SetValueType(&pRVar20->super_Opnd,valueType);
            }
            pIVar16 = InsertMove(&pRVar20->super_Opnd,&opnd->super_Opnd,*ldElem,true);
            if (local_78 != (RegOpnd *)0x0) {
              IVar2 = (pRVar20->super_Opnd).m_type;
              if (TySize[(local_78->super_Opnd).m_type] != (uint)IVar2) {
                pOVar26 = IR::Opnd::UseWithNewType(&local_78->super_Opnd,IVar2,this->m_func);
                local_78 = IR::Opnd::AsRegOpnd(pOVar26);
              }
              pIVar16 = InsertAnd(&pRVar20->super_Opnd,&pRVar20->super_Opnd,&local_78->super_Opnd,
                                  *ldElem);
            }
            if (local_50 == 3) {
              uVar29 = *(ushort *)&(*ldElem)->field_0x36 & 2;
              uVar3 = *(ushort *)&pIVar16->field_0x36;
              *(ushort *)&pIVar16->field_0x36 = uVar3 & 0xfffd | uVar29;
              *(ushort *)&pIVar16->field_0x36 =
                   uVar3 & 0xfff9 | uVar29 | *(ushort *)&(*ldElem)->field_0x36 & 4;
              if ((opnd->super_Opnd).m_type == TyUint32) {
                this_01 = (Lowerer *)0x0;
                pIVar22 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,true);
                InsertCompareBranch(this_01,&pRVar20->super_Opnd,&pIVar22->super_Opnd,BrLt_A,false,
                                    (LabelInstr *)pLVar15,*ldElem,false);
              }
              local_31[0] = true;
            }
            else {
              pIVar16 = IR::Instr::New(ToVar,pOVar35,&pRVar20->super_Opnd,this->m_func);
              uVar29 = *(ushort *)&(*ldElem)->field_0x36 & 2;
              uVar3 = *(ushort *)&pIVar16->field_0x36;
              *(ushort *)&pIVar16->field_0x36 = uVar3 & 0xfffd | uVar29;
              *(ushort *)&pIVar16->field_0x36 =
                   uVar3 & 0xfff9 | uVar29 | *(ushort *)&(*ldElem)->field_0x36 & 4;
              IR::Instr::InsertBefore(*ldElem,pIVar16);
              LowererMD::EmitLoadVar
                        (&this->m_lowererMD,pIVar16,(opnd->super_Opnd).m_type == TyUint32,false);
            }
          }
          InsertBranch(Br,false,(LabelInstr *)local_68,*ldElem);
          pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
          uVar12 = JITTimeFunctionBody::GetSourceContextId(pJVar23);
          pFVar24 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
          uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar24);
          bVar7 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_015cd718,TypedArrayTypeSpecPhase,uVar12,uVar13);
          pOVar26 = pOVar35;
          if (bVar7) {
            pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
            uVar12 = JITTimeFunctionBody::GetSourceContextId(pJVar23);
            pFVar24 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
            uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar24);
            bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,LowererPhase,uVar12,uVar13);
            if (bVar7) {
              ValueType::ToString((ValueType *)&local_52.field_0,(char (*) [256])local_1c8);
              pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
              pcVar25 = JITTimeFunctionBody::GetDisplayName(pJVar23);
              pFVar24 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
              pOVar26 = (Opnd *)FunctionJITTimeInfo::GetDebugNumberSet
                                          (pFVar24,(wchar (*) [42])local_228);
              pcVar27 = Js::OpCodeUtil::GetOpCodeName((*ldElem)->m_opcode);
              pcVar32 = L"specialized";
              if (pOVar35->m_type == TyVar) {
                pcVar32 = L"not specialized";
              }
              Output::Print(L"Typed Array Lowering: function: %s (%s), instr: %s, base value type: %S, %s."
                            ,pcVar25,pOVar26,pcVar27,local_1c8,pcVar32);
              Output::Print(L"\n");
              Output::Flush();
            }
          }
          bVar34 = (byte)pOVar26;
          IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseIndirOpnd.autoDelete);
          target = (LabelInstr *)0x0;
        }
        else {
          InsertMove(pOVar35,&opnd->super_Opnd,*ldElem,true);
          if (local_78 != (RegOpnd *)0x0) {
            if (TySize[(local_78->super_Opnd).m_type] != (uint)pOVar35->m_type) {
              pOVar26 = IR::Opnd::UseWithNewType(&local_78->super_Opnd,pOVar35->m_type,this->m_func)
              ;
              local_78 = IR::Opnd::AsRegOpnd(pOVar26);
            }
            InsertAnd(pOVar35,pOVar35,&local_78->super_Opnd,*ldElem);
          }
          if (bVar9 == false && local_53 == false) {
            bVar34 = (*ldElem)->m_opcode == LdMethodElem;
          }
          else {
            bVar34 = false;
          }
          if (local_53 == false) {
            bVar7 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_52.field_0);
            if (bVar7) {
              bVar7 = ValueType::HasNoMissingValues((ValueType *)&local_52.field_0);
              local_50 = (uint)CONCAT71(extraout_var_01,bVar7);
            }
            else {
              local_50 = 0;
            }
            local_50 = local_50 ^ 1;
          }
          else {
            local_50 = 0;
          }
          if ((char)local_50 == '\0') {
LAB_005b75e7:
            target = (LabelInstr *)0x0;
          }
          else {
            pLVar30 = local_68;
            if ((bool)bVar34 != false) {
              pLVar30 = pLVar15;
            }
            InsertMissingItemCompareBranch
                      (this,pOVar35,bVar34 ^ BrNeq_A,(LabelInstr *)pLVar30,*ldElem);
            if (bVar9 == false) goto LAB_005b75e7;
            if ((bool)bVar34 != false) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar14 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x489e,"(!needObjectTest)","!needObjectTest");
              if (!bVar7) goto LAB_005b7d8b;
              *puVar14 = 0;
            }
            if (pLVar15 == local_60) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar14 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x489f,"(labelHelper != labelBailOut)",
                                 "labelHelper != labelBailOut");
              if (!bVar7) goto LAB_005b7d8b;
              *puVar14 = 0;
            }
            pLVar30 = local_60;
            pPVar21 = IR::Instr::AsProfiledInstr(*ldElem);
            local_1c8._0_2_ = (((pPVar21->u).ldElemInfo)->elemType).field_0.bits;
            bVar7 = ValueType::HasBeenUndefined((ValueType *)local_1c8);
            if (bVar7) {
              target = IR::LabelInstr::New(Label,this->m_func,true);
              InsertBranch(Br,false,target,*ldElem);
            }
            else {
              target = (LabelInstr *)0x0;
              InsertBranch(Br,false,(LabelInstr *)pLVar30,*ldElem);
            }
          }
          if ((bool)bVar34 == false) {
            if ((char)local_50 == '\0') {
              InsertBranch(Br,false,(LabelInstr *)local_68,*ldElem);
            }
          }
          else {
            LowererMD::GenerateObjectTest
                      (&this->m_lowererMD,pOVar35,*ldElem,(LabelInstr *)local_68,true);
          }
        }
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_c8);
        bVar33 = 1;
      }
      cVar31 = (char)maskOpnd;
      pLVar30 = local_60;
    }
    else {
      if ((*ldElem)->m_dst->m_type != TyVar) {
        if ((*ldElem)->m_kind != InstrKindProfiled) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x4742,"(ldElem->IsProfiledInstr())","ldElem->IsProfiledInstr()");
          if (!bVar7) goto LAB_005b7d8b;
          *puVar14 = 0;
        }
        local_60 = (LowererMD *)IR::LabelInstr::New(Label,this->m_func,true);
        pLVar30 = local_60;
        goto LAB_005b6b75;
      }
      bVar34 = 1;
      bVar33 = 0;
      cVar31 = '\0';
      target = (LabelInstr *)0x0;
      pLVar30 = (LowererMD *)0x0;
    }
LAB_005b7d15:
    if (cVar31 == '\0') goto LAB_005b6ae5;
  }
  if (bVar33 == 0) {
    ppOVar1 = (pLVar15->lowererMDArch).helperCallArgs + 9;
    *(byte *)ppOVar1 = *(byte *)ppOVar1 & 0xfd;
  }
  IR::Instr::InsertBefore(*ldElem,(Instr *)pLVar15);
  *instrIsInHelperBlockRef = true;
  if (bVar9 != false) {
    if (((*ldElem)->field_0x38 & 0x10) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x48cc,"(ldElem->HasBailOutInfo())","ldElem->HasBailOutInfo()");
      if (!bVar7) goto LAB_005b7d8b;
      *puVar14 = 0;
    }
    local_60 = pLVar30;
    if (pLVar15 == pLVar30) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x48cd,"(labelHelper != labelBailOut)","labelHelper != labelBailOut");
      if (!bVar7) goto LAB_005b7d8b;
      *puVar14 = 0;
    }
    LowerOneBailOutKind(this,*ldElem,BailOutConventionalNativeArrayAccessOnly,false,false);
    pIVar16 = *ldElem;
    insertBeforeInstr = pIVar16->m_next;
    if (pIVar16->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar7) goto LAB_005b7d8b;
      *puVar14 = 0;
    }
    local_1c8._0_2_ = *(undefined2 *)((long)pIVar16[1]._vptr_Instr + 2);
    bVar7 = ValueType::HasBeenUndefined((ValueType *)local_1c8);
    pLVar15 = local_60;
    if (bVar7) {
      if (local_31[0] == false) {
        if (target == (LabelInstr *)0x0) {
          target = IR::LabelInstr::New(Label,this->m_func,true);
          (target->super_Instr).m_noLazyHelperAssert = true;
        }
        InsertMissingItemCompareBranch(this,(*ldElem)->m_dst,BrEq_A,target,insertBeforeInstr);
      }
      InsertBranch(Br,false,(LabelInstr *)local_68,insertBeforeInstr);
      if (target != (LabelInstr *)0x0) {
        IR::Instr::InsertBefore(insertBeforeInstr,&target->super_Instr);
        pOVar35 = (*ldElem)->m_src1;
        OVar8 = IR::Opnd::GetKind(pOVar35);
        if (OVar8 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (!bVar7) goto LAB_005b7d8b;
          *puVar14 = 0;
        }
        local_1c8._0_2_ = *(undefined2 *)(pOVar35[1]._vptr_Opnd + 1);
        bVar7 = ValueType::HasIntElements((ValueType *)local_1c8);
        fnHelper = HelperIntArr_ToVarArray;
        if (!bVar7) {
          local_1c8._0_2_ = *(undefined2 *)(pOVar35[1]._vptr_Opnd + 1);
          bVar7 = ValueType::HasFloatElements((ValueType *)local_1c8);
          fnHelper = HelperFloatArr_ToVarArray;
          if (!bVar7) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar14 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x4905,
                               "(indirOpnd->GetBaseOpnd()->GetValueType().HasFloatElements())",
                               "indirOpnd->GetBaseOpnd()->GetValueType().HasFloatElements()");
            if (!bVar7) goto LAB_005b7d8b;
            *puVar14 = 0;
          }
        }
        local_68 = &this->m_lowererMD;
        LowererMD::LoadHelperArgument(local_68,insertBeforeInstr,(Opnd *)pOVar35[1]._vptr_Opnd);
        pIVar16 = IR::Instr::New(Call,this->m_func);
        this_00 = IR::HelperCallOpnd::New(fnHelper,this->m_func);
        if (pIVar16->m_src1 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
          if (!bVar7) goto LAB_005b7d8b;
          *puVar14 = 0;
        }
        pFVar5 = pIVar16->m_func;
        if ((this_00->super_Opnd).isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar7) {
LAB_005b7d8b:
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          *puVar14 = 0;
        }
        bVar34 = (this_00->super_Opnd).field_0xb;
        if ((bVar34 & 2) != 0) {
          this_00 = (HelperCallOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar5);
          bVar34 = (this_00->super_Opnd).field_0xb;
        }
        (this_00->super_Opnd).field_0xb = bVar34 | 2;
        pIVar16->m_src1 = &this_00->super_Opnd;
        IR::Instr::InsertBefore(insertBeforeInstr,pIVar16);
        LowererMD::LowerCall(local_68,pIVar16,0);
        pLVar15 = local_60;
      }
    }
    else {
      if (local_31[0] == false) {
        InsertMissingItemCompareBranch
                  (this,(*ldElem)->m_dst,BrEq_A,(LabelInstr *)local_60,insertBeforeInstr);
      }
      InsertBranch(Br,false,(LabelInstr *)local_68,insertBeforeInstr);
    }
    IR::Instr::InsertBefore(insertBeforeInstr,(Instr *)pLVar15);
  }
  if (local_31[0] == true) {
    IR::Instr::UnlinkSrc1(*ldElem);
    IR::Instr::UnlinkDst(*ldElem);
    GenerateBailOut(this,*ldElem,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  }
  bVar34 = local_31[0] ^ 1;
LAB_005b6ae5:
  return (bool)(bVar34 & 1);
}

Assistant:

bool
Lowerer::GenerateFastLdElemI(IR::Instr *& ldElem, bool *instrIsInHelperBlockRef)
{
    Assert(instrIsInHelperBlockRef);
    bool &instrIsInHelperBlock = *instrIsInHelperBlockRef;
    instrIsInHelperBlock = false;

    IR::LabelInstr *    labelHelper;
    IR::LabelInstr *    labelFallThru;
    IR::LabelInstr *    labelBailOut = nullptr;
    IR::LabelInstr *    labelMissingNative = nullptr;
    IR::Opnd *src1 =    ldElem->GetSrc1();

    AssertMsg(src1->IsIndirOpnd(), "Expected indirOpnd on LdElementI");

    IR::IndirOpnd *     indirOpnd = src1->AsIndirOpnd();

    // From FastElemICommon:
    //  TEST base, AtomTag                  -- check base not tagged int
    //  JNE $helper
    //  MOV r1, [base + offset(type)]       -- check base isArray
    //  CMP [r1 + offset(typeId)], TypeIds_Array
    //  JNE $helper
    //  TEST index, 1                       -- index tagged int
    //  JEQ $helper
    //  MOV r2, index
    //  SAR r2, Js::VarTag_Shift            -- remoe atom tag
    //  JS $helper                          -- exclude negative index
    //  MOV r4, [base + offset(head)]
    //  CMP r2, [r4 + offset(length)]       -- bounds check
    //  JAE $helper
    //  MOV r3, [r4 + offset(elements)]

    // Generated here:
    //  MOV dst, [r3 + r2]
    //  TEST dst, dst
    //  JNE $fallthrough

    if(ldElem->m_opcode == Js::OpCode::LdMethodElem && indirOpnd->GetBaseOpnd()->GetValueType().IsLikelyOptimizedTypedArray())
    {
        // Typed arrays don't return objects, so it's not worth generating a fast path for LdMethodElem. Calling the helper also
        // generates a better error message. Skip the fast path and just generate a helper call.
        return true;
    }

    labelFallThru = ldElem->GetOrCreateContinueLabel();
    labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    // If we know for sure (based on flow graph) we're loading from the arguments object, then ignore the (path-based) profile info.
    bool isNativeArrayLoad = !ldElem->DoStackArgsOpt() && indirOpnd->GetBaseOpnd()->GetValueType().IsLikelyNativeArray();
    bool needMissingValueCheck = true;
    bool emittedFastPath = false;
    bool emitBailout = false;

    if (ldElem->DoStackArgsOpt())
    {
        emittedFastPath = GenerateFastArgumentsLdElemI(ldElem, labelFallThru);
        emitBailout = true;
    }
    else if (GenerateFastStringLdElem(ldElem, labelHelper, labelFallThru))
    {
        emittedFastPath = true;
    }
    else
    {
        IR::LabelInstr * labelCantUseArray = labelHelper;
        if (isNativeArrayLoad)
        {
            if (ldElem->GetDst()->GetType() == TyVar)
            {
                // Skip the fast path and just generate a helper call
                return true;
            }

            // Specialized native array lowering for LdElem requires that it is profiled. When not profiled, GlobOpt should not
            // have specialized it.
            Assert(ldElem->IsProfiledInstr());

            labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
            labelCantUseArray = labelBailOut;
        }
        Js::FldInfoFlags flags = Js::FldInfo_NoInfo;
        if (ldElem->IsProfiledInstr())
        {
            flags = ldElem->AsProfiledInstr()->u.ldElemInfo->flags;
        }
        bool isTypedArrayElement, isStringIndex, indirOpndOverflowed = false;
        IR::Opnd* maskOpnd = nullptr;
        indirOpnd =
            GenerateFastElemICommon(
                ldElem,
                false,
                src1->AsIndirOpnd(),
                labelHelper,
                labelCantUseArray,
                labelFallThru,
                &isTypedArrayElement,
                &isStringIndex,
                &emitBailout,
                &maskOpnd,
                nullptr,    /* pLabelSegmentLengthIncreased */
                true,       /* checkArrayLengthOverflow */
                false,      /* forceGenerateFastPath */
                false,      /* returnLength */
                nullptr,    /* bailOutLabelInstr */
                &indirOpndOverflowed,
                flags);

        IR::Opnd *dst = ldElem->GetDst();
        IRType dstType = dst->AsRegOpnd()->GetType();

        // The index is negative or not int.
        if (indirOpnd == nullptr)
        {
            // could have bailout kind BailOutOnArrayAccessHelperCall if indirOpnd overflows
            Assert(!(ldElem->HasBailOutInfo() && ldElem->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall) || indirOpndOverflowed);

            // don't check fast path without bailout because it might not be TypedArray
            if (indirOpndOverflowed && ldElem->HasBailOutInfo())
            {
                bool bailoutForOpndOverflow = false;
                const IR::BailOutKind bailOutKind = ldElem->GetBailOutKind();

                // return undefined for typed array if load dest is var, bailout otherwise
                if ((bailOutKind & ~IR::BailOutKindBits) == IR::BailOutConventionalTypedArrayAccessOnly)
                {
                    if (dst->IsVar())
                    {
                        // returns undefined in case of indirOpnd overflow which is consistent with behavior of interpreter
                        IR::Opnd * undefinedOpnd = this->LoadLibraryValueOpnd(ldElem, LibraryValue::ValueUndefined);
                        InsertMove(dst, undefinedOpnd, ldElem);

                        ldElem->FreeSrc1();
                        ldElem->FreeDst();
                        ldElem->Remove();

                        emittedFastPath = true;
                    }
                    else
                    {
                        bailoutForOpndOverflow = true;
                    }
                }

                if (bailoutForOpndOverflow || (bailOutKind & (IR::BailOutConventionalNativeArrayAccessOnly | IR::BailOutOnArrayAccessHelperCall)))
                {
                    IR::Opnd * constOpnd = nullptr;
                    if (dst->IsFloat())
                    {
                        constOpnd = IR::FloatConstOpnd::New(Js::JavascriptNumber::NaN, TyFloat64, m_func);
                    }
                    else
                    {
                        constOpnd = IR::IntConstOpnd::New(0, TyInt32, this->m_func, true);
                    }
                    InsertMove(dst, constOpnd, ldElem);

                    ldElem->FreeSrc1();
                    ldElem->FreeDst();
                    GenerateBailOut(ldElem, nullptr, nullptr);
                    emittedFastPath = true;
                }

                return !emittedFastPath;
            }
            // The global optimizer should never type specialize a LdElem for which the index is not int or an integer constant
            // with a negative value. This would force an unconditional bail out on the main code path.
            else if (dst->IsVar())
            {
                if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->m_func) && PHASE_TRACE(Js::LowererPhase, this->m_func))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(_u("Typed Array Lowering: function: %s (%s): instr %s, not specialized by glob opt due to negative or not likely int index.\n"),
                        this->m_func->GetJITFunctionBody()->GetDisplayName(),
                        this->m_func->GetDebugNumberSet(debugStringBuffer),
                        Js::OpCodeUtil::GetOpCodeName(ldElem->m_opcode));
                    Output::Flush();
                }

                // We must be dealing with some unconventional index value.  Don't emit fast path, but go directly to helper.
                emittedFastPath = false;
                return true;
            }
            else
            {
                AssertMsg(false, "Global optimizer shouldn't have specialized this instruction.");
                Assert(dst->IsRegOpnd());

                // If global optimizer failed to notice the unconventional index and type specialized the dst,
                // there is nothing to do but bail out. This could happen if global optimizer's information based
                // on value tracking fails to recognize a non-integer index or a constant int index that is negative.
                // The bailout below ensures that we behave correctly in retail builds even under
                // these (unlikely) conditions. To satisfy the downstream code we must populate the type specialized operand
                // with some made up values, even though we will unconditionally bail out here and the values will never be
                // used.
                IR::IntConstOpnd *constOpnd = IR::IntConstOpnd::New(0, TyInt32, this->m_func, true);
                InsertMove(dst, constOpnd, ldElem);

                ldElem->FreeSrc1();
                ldElem->FreeDst();
                GenerateBailOut(ldElem, nullptr, nullptr);
                return false;
            }
        }

        const IR::AutoReuseOpnd autoReuseIndirOpnd(indirOpnd, m_func);
        const ValueType baseValueType(src1->AsIndirOpnd()->GetBaseOpnd()->GetValueType());

        if ((ldElem->HasBailOutInfo() &&
                ldElem->GetByteCodeOffset() != Js::Constants::NoByteCodeOffset &&
                ldElem->GetBailOutInfo()->bailOutOffset <= ldElem->GetByteCodeOffset() &&
                dst->IsEqual(src1->AsIndirOpnd()->GetBaseOpnd())) ||
            (src1->AsIndirOpnd()->GetIndexOpnd() && dst->IsEqual(src1->AsIndirOpnd()->GetIndexOpnd())))
        {
            // This is a pre-op bailout where the dst is the same as one of the srcs. The dst may be trashed before bailing out,
            // but since the operation will be processed again in the interpreter, src values need to be kept intact. Use a
            // temporary dst until after the operation is complete.
            IR::Instr *instrSink = ldElem->SinkDst(Js::OpCode::Ld_A);

            // The sink instruction needs to be on the fall-through path
            instrSink->Unlink();
            labelFallThru->InsertAfter(instrSink);

            LowererMD::ChangeToAssign(instrSink);
            dst = ldElem->GetDst();
        }

        if (isTypedArrayElement)
        {
            // For typedArrays, convert the loaded element to the appropriate type
            IR::RegOpnd *reg;
            IR::AutoReuseOpnd autoReuseReg;

            Assert(dst->IsRegOpnd());

            if(indirOpnd->IsFloat())
            {
                AssertMsg((dstType == TyFloat64) || (dstType == TyVar), "For Float32Array LdElemI's dst should be specialized to TyFloat64 or not at all.");

                if(indirOpnd->IsFloat32())
                {
                    // MOVSS reg32.f32, indirOpnd.f32
                    IR::RegOpnd *reg32 = IR::RegOpnd::New(TyFloat32, this->m_func);
                    const IR::AutoReuseOpnd autoReuseReg32(reg32, m_func);
                    InsertMove(reg32, indirOpnd, ldElem);

                    // CVTPS2PD dst/reg.f64, reg32.f64
                    reg = dstType == TyFloat64 ? dst->AsRegOpnd() : IR::RegOpnd::New(TyFloat64, this->m_func);
                    autoReuseReg.Initialize(reg, m_func);
                    InsertConvertFloat32ToFloat64(reg, reg32, ldElem);
                }
                else
                {
                    Assert(indirOpnd->IsFloat64());

                    // MOVSD dst/reg.f64, indirOpnd.f64
                    reg = dstType == TyFloat64 ? dst->AsRegOpnd() : IR::RegOpnd::New(TyFloat64, this->m_func);
                    autoReuseReg.Initialize(reg, m_func);
                    InsertMove(reg, indirOpnd, ldElem);
                }

                if (dstType != TyFloat64)
                {
                    // Convert reg.f64 to var
                    m_lowererMD.SaveDoubleToVar(dst->AsRegOpnd(), reg, ldElem, ldElem);
                }

#if FLOATVAR
                // For NaNs, go to the helper to guarantee we don't have an illegal NaN
                // TODO(magardn): move this to MD code.
#if _M_X64
                // UCOMISD reg, reg
                {
                    IR::Instr *const instr = IR::Instr::New(Js::OpCode::UCOMISD, this->m_func);
                    instr->SetSrc1(reg);
                    instr->SetSrc2(reg);
                    ldElem->InsertBefore(instr);
                }

                // JP $helper
                {
                    IR::Instr *const instr = IR::BranchInstr::New(Js::OpCode::JP, labelHelper, this->m_func);
                    ldElem->InsertBefore(instr);
                }
#elif _M_ARM64
                // FCMP reg, reg
                {
                    IR::Instr *const instr = IR::Instr::New(Js::OpCode::FCMP, this->m_func);
                    instr->SetSrc1(reg);
                    instr->SetSrc2(reg);
                    ldElem->InsertBefore(instr);
                }

                // BVS $helper
                {
                    IR::Instr *const instr = IR::BranchInstr::New(Js::OpCode::BVS, labelHelper, this->m_func);
                    ldElem->InsertBefore(instr);
                }
#endif
#endif

                if(dstType == TyFloat64)
                {
                    emitBailout = true;
                }
            }
            else
            {
                AssertMsg((dstType == TyInt32) || (dstType == TyVar), "For Int/UintArray LdElemI's dst should be specialized to TyInt32 or not at all.");

                reg = dstType == TyInt32 ? dst->AsRegOpnd() : IR::RegOpnd::New(TyInt32, this->m_func);
                autoReuseReg.Initialize(reg, m_func);

                // Int32 and Uint32 arrays could overflow an int31, but the others can't
                if (indirOpnd->GetType() != TyUint32
#if !INT32VAR
                    && indirOpnd->GetType() != TyInt32
#endif
                    )
                {
                    reg->SetValueType(ValueType::GetTaggedInt());  // Fits as a tagged-int
                }

                // MOV/MOVZX/MOVSX dst/reg.int32, IndirOpnd.type
                IR::Instr* instrMov = InsertMove(reg, indirOpnd, ldElem);
                if (maskOpnd)
                {
#if TARGET_64
                    if (maskOpnd->GetSize() != reg->GetType())
                    {
                        maskOpnd = maskOpnd->UseWithNewType(reg->GetType(), m_func)->AsRegOpnd();
                    }
#endif
                    instrMov = InsertAnd(reg, reg, maskOpnd, ldElem);
                }

                if (dstType == TyInt32)
                {
                    instrMov->dstIsTempNumber = ldElem->dstIsTempNumber;
                    instrMov->dstIsTempNumberTransferred = ldElem->dstIsTempNumberTransferred;

                    if (indirOpnd->GetType() == TyUint32)
                    {
                        // TEST dst, dst
                        // JSB $helper (bailout)
                        InsertCompareBranch(
                            reg,
                            IR::IntConstOpnd::New(0, TyUint32, this->m_func, /* dontEncode = */ true),
                            Js::OpCode::BrLt_A,
                            labelHelper,
                            ldElem);
                    }

                    emitBailout = true;
                }
                else
                {
                    // MOV dst, reg
                    IR::Instr *const instr = IR::Instr::New(Js::OpCode::ToVar, dst, reg, this->m_func);
                    instr->dstIsTempNumber = ldElem->dstIsTempNumber;
                    instr->dstIsTempNumberTransferred = ldElem->dstIsTempNumberTransferred;
                    ldElem->InsertBefore(instr);

                    // Convert dst to var
                    m_lowererMD.EmitLoadVar(instr, /* isFromUint32 = */ (indirOpnd->GetType() == TyUint32));
                }
            }

            //  JMP $fallthrough
            InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

            emittedFastPath = true;

            if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->m_func) && PHASE_TRACE(Js::LowererPhase, this->m_func))
            {
                char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                baseValueType.ToString(baseValueTypeStr);
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("Typed Array Lowering: function: %s (%s), instr: %s, base value type: %S, %s."),
                    this->m_func->GetJITFunctionBody()->GetDisplayName(),
                    this->m_func->GetDebugNumberSet(debugStringBuffer),
                    Js::OpCodeUtil::GetOpCodeName(ldElem->m_opcode),
                    baseValueTypeStr,
                    (!dst->IsVar() ? _u("specialized") : _u("not specialized")));
                Output::Print(_u("\n"));
                Output::Flush();
            }
        }
        else
        {
            // MOV dst, indirOpnd
            InsertMove(dst, indirOpnd, ldElem);
            if (maskOpnd)
            {
#if TARGET_64
                if (maskOpnd->GetSize() != dst->GetType())
                {
                    maskOpnd = maskOpnd->UseWithNewType(dst->GetType(), m_func)->AsRegOpnd();
                }
#endif
                InsertAnd(dst, dst, maskOpnd, ldElem);
            }

            // The string index fast path does not operate on index properties (we don't get a PropertyString in that case), so
            // we don't need to do any further checks in that case

            // For LdMethodElem, if the loaded value is a tagged number, the error message generated by the helper call is
            // better than if we were to just try to call the number. Also, the call arguments need to be evaluated before
            // throwing the error, so just test whether it's an object and jump to helper if it's not.
            const bool needObjectTest = !isStringIndex && !isNativeArrayLoad && ldElem->m_opcode == Js::OpCode::LdMethodElem;
            needMissingValueCheck =
                !isStringIndex && !(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues());
            if(needMissingValueCheck)
            {
                //  TEST dst, dst
                //  JEQ $helper | JNE $fallthrough
                InsertMissingItemCompareBranch(
                    dst,
                    needObjectTest ? Js::OpCode::BrEq_A : Js::OpCode::BrNeq_A,
                    needObjectTest ? labelHelper : labelFallThru,
                    ldElem);

                if (isNativeArrayLoad)
                {
                    Assert(!needObjectTest);
                    Assert(labelHelper != labelBailOut);
                    if(ldElem->AsProfiledInstr()->u.ldElemInfo->GetElementType().HasBeenUndefined())
                    {
                        // We're going to bail out trying to load "missing value" into a type-spec'd opnd.
                        // Branch to a point where we'll convert the array so that we don't keep bailing here.
                        // (Gappy arrays are not well-suited to nativeness.)
                        labelMissingNative = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
                        InsertBranch(Js::OpCode::Br, labelMissingNative, ldElem);
                    }
                    else
                    {
                        // If the value has not been profiled to be undefined at some point, jump directly to bail out
                        InsertBranch(Js::OpCode::Br, labelBailOut, ldElem);
                    }
                }
            }
            if(needObjectTest)
            {
                //  GenerateObjectTest(dst)
                //  JIsObject $fallthrough
                m_lowererMD.GenerateObjectTest(dst, ldElem, labelFallThru, true);
            }
            else if(!needMissingValueCheck)
            {
                //  JMP $fallthrough
                InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);
            }

            emittedFastPath = true;
        }
    }
    // $helper:
    //      bailout or caller generated helper call
    // $fallthru:

    if (!emittedFastPath)
    {
        labelHelper->isOpHelper = false;
    }

    ldElem->InsertBefore(labelHelper);
    instrIsInHelperBlock = true;

    if (isNativeArrayLoad)
    {
        Assert(ldElem->HasBailOutInfo());
        Assert(labelHelper != labelBailOut);

        // Transform the original instr:
        //
        // $helper:
        // dst = LdElemI_A src (BailOut)
        // $fallthrough:
        //
        // to:
        //
        // b $fallthru  <--- we get here if we loaded a valid element directly
        // $helper:
        // dst = LdElemI_A src
        // cmp dst, MissingItem
        // bne $fallthrough
        // $bailout:
        //       BailOut
        // $fallthrough:

        LowerOneBailOutKind(ldElem, IR::BailOutConventionalNativeArrayAccessOnly, instrIsInHelperBlock);
        IR::Instr *const insertBeforeInstr = ldElem->m_next;

        // Do missing value check on value returned from helper so that we don't have to check the index against
        // array length. (We already checked it above against the segment length.)

        bool hasBeenUndefined = ldElem->AsProfiledInstr()->u.ldElemInfo->GetElementType().HasBeenUndefined();
        if (hasBeenUndefined)
        {
            if(!emitBailout)
            {
                if (labelMissingNative == nullptr)
                {
                    labelMissingNative = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
#if DBG
                    labelMissingNative->m_noLazyHelperAssert = true;
#endif
                }

                InsertMissingItemCompareBranch(ldElem->GetDst(), Js::OpCode::BrEq_A, labelMissingNative, insertBeforeInstr);
            }
            InsertBranch(Js::OpCode::Br, labelFallThru, insertBeforeInstr);
            if(labelMissingNative)
            {
                // We're going to bail out on a load from a gap, but convert the array to Var first, so we don't just
                // bail here over and over. Gappy arrays are not well suited to nativeness.
                // NOTE: only emit this call if the profile tells us that this has happened before ("hasBeenUndefined").
                // Emitting this in Navier-Stokes brutalizes the score.
                insertBeforeInstr->InsertBefore(labelMissingNative);
                IR::JnHelperMethod helperMethod;
                indirOpnd = ldElem->GetSrc1()->AsIndirOpnd();
                if (indirOpnd->GetBaseOpnd()->GetValueType().HasIntElements())
                {
                    helperMethod = IR::HelperIntArr_ToVarArray;
                }
                else
                {
                    Assert(indirOpnd->GetBaseOpnd()->GetValueType().HasFloatElements());
                    helperMethod = IR::HelperFloatArr_ToVarArray;
                }
                m_lowererMD.LoadHelperArgument(insertBeforeInstr, indirOpnd->GetBaseOpnd());
                IR::Instr *instrHelper = IR::Instr::New(Js::OpCode::Call, m_func);
                instrHelper->SetSrc1(IR::HelperCallOpnd::New(helperMethod, m_func));
                insertBeforeInstr->InsertBefore(instrHelper);
                m_lowererMD.LowerCall(instrHelper, 0);
            }
        }
        else
        {
            if(!emitBailout)
            {
                InsertMissingItemCompareBranch(ldElem->GetDst(), Js::OpCode::BrEq_A, labelBailOut, insertBeforeInstr);
            }

            InsertBranch(Js::OpCode::Br, labelFallThru, insertBeforeInstr);
        }

        insertBeforeInstr->InsertBefore(labelBailOut);
    }

    if (emitBailout)
    {
        ldElem->UnlinkSrc1();
        ldElem->UnlinkDst();
        GenerateBailOut(ldElem, nullptr, nullptr);
    }

    return !emitBailout;
}